

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GMAA_kGMAA.cpp
# Opt level: O0

bool __thiscall
GMAA_kGMAA::ConstructAndValuateNextPolicies
          (GMAA_kGMAA *this,PartialPolicyPoolItemInterface_sharedPtr *ppi,
          PartialPolicyPoolInterface_sharedPtr *poolOfNextPolicies,bool *cleanUpPPI)

{
  MultiAgentDecisionProcessInterface *pMVar1;
  bool bVar2;
  int iVar3;
  Index IVar4;
  type pPVar5;
  type pPVar6;
  size_t sVar7;
  size_t sVar8;
  ulong uVar9;
  undefined4 extraout_var;
  LIndex i;
  reference pvVar10;
  type pBVar11;
  ostream *poVar12;
  type pBVar13;
  type pPVar14;
  type pJVar15;
  type pJVar16;
  undefined1 *in_RCX;
  shared_ptr<PartialPolicyPoolInterface> *in_RDX;
  shared_ptr<PartialPolicyPoolItemInterface> *in_RSI;
  PlanningUnit *in_RDI;
  double dVar17;
  undefined1 extraout_var_00 [56];
  undefined1 auVar18 [64];
  undefined1 auVar19 [16];
  double newValue;
  double newPastreward;
  double immR;
  double discounted_F;
  double discountToThePowerT;
  double val;
  PJPDP_sharedPtr jpolTs;
  JPPV_sharedPtr bgpol;
  shared_ptr<JPPVValuePair> jpvp;
  Index solI;
  shared_ptr<BayesianGameIdenticalPayoffSolver> bgips;
  stringstream ss;
  JointPolicyPureVector jpolBG;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  poolOfNextPoliciesIndices;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *nrOHts;
  double prevPastReward;
  stringstream ss_1;
  shared_ptr<BayesianGameForDecPOMDPStage> bg_ts;
  Index agI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> firstOHtsI;
  bool is_last_ts;
  size_t ts;
  PJPDP_sharedPtr jpolPrevTs;
  Index in_stack_fffffffffffff8b8;
  Index in_stack_fffffffffffff8bc;
  byte bVar20;
  PlanningUnitMADPDiscrete *in_stack_fffffffffffff8c0;
  JointPolicyPureVector *this_00;
  allocator_type *in_stack_fffffffffffff8d0;
  BayesianGameForDecPOMDPStage *in_stack_fffffffffffff8d8;
  JointPolicyPureVector *in_stack_fffffffffffff8e0;
  shared_ptr<JointPolicyDiscretePure> *psVar21;
  shared_ptr<BayesianGameIdenticalPayoffSolver> *in_stack_fffffffffffff920;
  shared_ptr<PartialPolicyPoolItemInterface> *in_stack_fffffffffffff928;
  GeneralizedMAAStarPlannerForDecPOMDPDiscrete *in_stack_fffffffffffff930;
  shared_ptr<const_PartialJointPolicyDiscretePure> *in_stack_fffffffffffff938;
  QFunctionJAOHInterface *in_stack_fffffffffffff940;
  PlanningUnitDecPOMDPDiscrete *in_stack_fffffffffffff948;
  undefined7 in_stack_fffffffffffff950;
  undefined1 in_stack_fffffffffffff957;
  string local_5a0 [32];
  undefined1 local_580 [16];
  double local_570;
  double local_568;
  shared_ptr<JointPolicyDiscretePure> local_558;
  double local_548;
  double local_540;
  double local_538;
  double local_530;
  shared_ptr<PartialJointPolicyDiscretePure> local_528;
  shared_ptr<JointPolicyPureVector> local_518;
  shared_ptr<JPPVValuePair> local_508;
  uint local_4f8;
  shared_ptr<const_BayesianGameIdenticalPayoffInterface> local_4f0;
  shared_ptr<BayesianGameIdenticalPayoffSolver> local_4e0;
  string local_4d0 [32];
  stringstream local_4b0 [16];
  ostream local_4a0 [384];
  shared_ptr<const_Interface_ProblemToPolicyDiscretePure> local_320 [13];
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_248;
  double local_240;
  string local_238 [32];
  stringstream local_218 [16];
  ostream local_208 [382];
  undefined1 local_8a;
  shared_ptr<const_PartialJointPolicyDiscretePure> local_88;
  shared_ptr<BayesianGameForDecPOMDPStage> local_78;
  uint local_68;
  undefined1 local_60 [27];
  byte local_45;
  size_t local_38;
  shared_ptr<PartialJointPolicyDiscretePure> local_30;
  shared_ptr<PartialPolicyPoolInterface> *local_18;
  
  *in_RCX = 1;
  local_18 = in_RDX;
  pPVar5 = boost::shared_ptr<PartialPolicyPoolItemInterface>::operator->(in_RSI);
  (*pPVar5->_vptr_PartialPolicyPoolItemInterface[2])();
  pPVar6 = boost::shared_ptr<PartialJointPolicyDiscretePure>::operator->(&local_30);
  sVar7 = JointPolicy::GetDepth((JointPolicy *)pPVar6);
  local_38 = sVar7;
  sVar8 = PlanningUnit::GetHorizon(in_RDI);
  local_45 = sVar7 == sVar8 - 1;
  (*in_RDI->_vptr_PlanningUnit[6])();
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x97c73e);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff8e0,
             (size_type)in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d0);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x97c76a);
  for (local_68 = 0; uVar9 = (ulong)local_68, iVar3 = (*in_RDI->_vptr_PlanningUnit[6])(),
      uVar9 < CONCAT44(extraout_var,iVar3); local_68 = local_68 + 1) {
    i = PlanningUnitMADPDiscrete::GetFirstObservationHistoryIndex
                  (in_stack_fffffffffffff8c0,in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8);
    IVar4 = Globals::CastLIndexToIndex(i);
    pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         in_stack_fffffffffffff8c0,
                         CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8));
    *pvVar10 = IVar4;
  }
  operator_new(0x150);
  local_8a = 1;
  boost::shared_ptr<const_PartialJointPolicyDiscretePure>::
  shared_ptr<PartialJointPolicyDiscretePure>(&local_88,&local_30);
  BayesianGameForDecPOMDPStage::BayesianGameForDecPOMDPStage
            ((BayesianGameForDecPOMDPStage *)
             CONCAT17(in_stack_fffffffffffff957,in_stack_fffffffffffff950),in_stack_fffffffffffff948
             ,in_stack_fffffffffffff940,in_stack_fffffffffffff938);
  local_8a = 0;
  boost::shared_ptr<BayesianGameForDecPOMDPStage>::shared_ptr<BayesianGameForDecPOMDPStage>
            ((shared_ptr<BayesianGameForDecPOMDPStage> *)in_stack_fffffffffffff8e0,
             in_stack_fffffffffffff8d8);
  boost::shared_ptr<const_PartialJointPolicyDiscretePure>::~shared_ptr
            ((shared_ptr<const_PartialJointPolicyDiscretePure> *)0x97c935);
  in_RDI[0x17]._m_horizon = in_RDI[0x17]._m_horizon + 1;
  bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffff8c0,
                          (char *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8));
  if (bVar2) {
    std::__cxx11::stringstream::stringstream(local_218);
    poVar12 = std::operator<<(local_208,(string *)&in_RDI[0x17]._m_seed);
    std::ostream::operator<<(poVar12,in_RDI[0x17]._m_horizon);
    boost::shared_ptr<BayesianGameForDecPOMDPStage>::operator*(&local_78);
    std::__cxx11::stringstream::str();
    BayesianGameIdenticalPayoff::Save
              ((BayesianGameIdenticalPayoff *)in_stack_fffffffffffff8c0,
               (string *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8));
    std::__cxx11::string::~string(local_238);
    std::__cxx11::stringstream::~stringstream(local_218);
  }
  pPVar6 = boost::shared_ptr<PartialJointPolicyDiscretePure>::operator->(&local_30);
  local_240 = PartialJointPolicy::GetPastReward(&pPVar6->super_PartialJointPolicy);
  pBVar11 = boost::shared_ptr<BayesianGameForDecPOMDPStage>::operator->(&local_78);
  local_248 = BayesianGameBase::GetNrTypes
                        ((BayesianGameBase *)&pBVar11->super_BayesianGameIdenticalPayoff);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)0x97cb7f);
  boost::shared_ptr<const_Interface_ProblemToPolicyDiscretePure>::
  shared_ptr<BayesianGameForDecPOMDPStage>(local_320,&local_78);
  JointPolicyPureVector::JointPolicyPureVector
            (in_stack_fffffffffffff8e0,(I_PtPDpure_constPtr *)in_stack_fffffffffffff8d8,
             (PolicyDomainCategory)((ulong)in_stack_fffffffffffff8d0 >> 0x20));
  boost::shared_ptr<const_Interface_ProblemToPolicyDiscretePure>::~shared_ptr
            ((shared_ptr<const_Interface_ProblemToPolicyDiscretePure> *)0x97cbc2);
  std::__cxx11::stringstream::stringstream(local_4b0);
  poVar12 = std::operator<<(local_4a0,"GMAA::kGMAA_ts");
  std::ostream::operator<<(poVar12,local_38);
  std::__cxx11::stringstream::str();
  TimedAlgorithm::StartTimer
            ((TimedAlgorithm *)in_stack_fffffffffffff8c0,
             (string *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8));
  auVar19 = std::__cxx11::string::~string(local_4d0);
  auVar18._0_8_ = auVar19._8_8_;
  dVar17 = auVar19._0_8_;
  auVar18._8_56_ = extraout_var_00;
  pMVar1 = in_RDI[0x1b]._m_problem;
  boost::shared_ptr<const_BayesianGameIdenticalPayoffInterface>::
  shared_ptr<BayesianGameForDecPOMDPStage>(&local_4f0,&local_78);
  (*pMVar1->_vptr_MultiAgentDecisionProcessInterface[2])(pMVar1,&local_4f0);
  boost::shared_ptr<BayesianGameIdenticalPayoffSolver>::
  shared_ptr<BayesianGameIdenticalPayoffSolver>
            ((shared_ptr<BayesianGameIdenticalPayoffSolver> *)in_stack_fffffffffffff8e0,
             (BayesianGameIdenticalPayoffSolver *)in_stack_fffffffffffff8d8);
  boost::shared_ptr<const_BayesianGameIdenticalPayoffInterface>::~shared_ptr
            ((shared_ptr<const_BayesianGameIdenticalPayoffInterface> *)0x97ccd2);
  GeneralizedMAAStarPlannerForDecPOMDPDiscrete::SetCBGbounds
            (in_stack_fffffffffffff930,in_stack_fffffffffffff928,in_stack_fffffffffffff920);
  pBVar13 = boost::shared_ptr<BayesianGameIdenticalPayoffSolver>::operator->(&local_4e0);
  (*pBVar13->_vptr_BayesianGameIdenticalPayoffSolver[4])();
  pBVar11 = boost::shared_ptr<BayesianGameForDecPOMDPStage>::operator->(&local_78);
  (*(pBVar11->super_BayesianGameForDecPOMDPStageInterface).
    _vptr_BayesianGameForDecPOMDPStageInterface[3])(pBVar11,0);
  local_4f8 = 0;
  do {
    auVar19 = auVar18._0_16_;
    if (*(ulong *)&in_RDI[0x18]._m_seed <= (ulong)local_4f8) {
LAB_0097d292:
      pBVar11 = boost::shared_ptr<BayesianGameForDecPOMDPStage>::operator->(&local_78);
      (*(pBVar11->super_BayesianGameForDecPOMDPStageInterface).
        _vptr_BayesianGameForDecPOMDPStageInterface[4])();
      this_00 = (JointPolicyPureVector *)&in_RDI[0x14]._m_horizon;
      std::__cxx11::stringstream::str();
      TimedAlgorithm::StopTimer
                ((TimedAlgorithm *)this_00,
                 (string *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8));
      std::__cxx11::string::~string(local_5a0);
      bVar20 = local_45;
      boost::shared_ptr<BayesianGameIdenticalPayoffSolver>::~shared_ptr
                ((shared_ptr<BayesianGameIdenticalPayoffSolver> *)0x97d319);
      std::__cxx11::stringstream::~stringstream(local_4b0);
      JointPolicyPureVector::~JointPolicyPureVector(this_00);
      std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
                ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                 0x97d340);
      boost::shared_ptr<BayesianGameForDecPOMDPStage>::~shared_ptr
                ((shared_ptr<BayesianGameForDecPOMDPStage> *)0x97d34d);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff8d0);
      boost::shared_ptr<PartialJointPolicyDiscretePure>::~shared_ptr
                ((shared_ptr<PartialJointPolicyDiscretePure> *)0x97d367);
      return (bool)(bVar20 & 1);
    }
    boost::shared_ptr<BayesianGameIdenticalPayoffSolver>::operator->(&local_4e0);
    bVar2 = BayesianGameIdenticalPayoffSolver::IsEmptyJPPV
                      ((BayesianGameIdenticalPayoffSolver *)0x97cd94);
    if (bVar2) {
      poVar12 = std::operator<<((ostream *)&std::cerr,"Warning, BGIP_Solver only returned ");
      poVar12 = (ostream *)std::ostream::operator<<(poVar12,local_4f8);
      poVar12 = std::operator<<(poVar12," usable joint policies");
      std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
      goto LAB_0097d292;
    }
    boost::shared_ptr<BayesianGameIdenticalPayoffSolver>::operator->(&local_4e0);
    BayesianGameIdenticalPayoffSolver::GetNextSolutionJPPV
              ((BayesianGameIdenticalPayoffSolver *)
               CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8));
    boost::shared_ptr<JPPVValuePair>::operator->(&local_508);
    JPPVValuePair::GetJPPV
              ((JPPVValuePair *)CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8));
    boost::shared_ptr<BayesianGameIdenticalPayoffSolver>::operator->(&local_4e0);
    BayesianGameIdenticalPayoffSolver::PopNextSolutionJPPV
              ((BayesianGameIdenticalPayoffSolver *)0x97cf4c);
    pPVar14 = boost::shared_ptr<PartialJointPolicyDiscretePure>::operator*(&local_30);
    pJVar15 = boost::shared_ptr<JointPolicyPureVector>::operator*(&local_518);
    (*in_RDI->_vptr_PlanningUnit[0x18])(&local_528,in_RDI,pPVar14,pJVar15,local_248,local_60);
    pJVar16 = boost::shared_ptr<JPPVValuePair>::operator->(&local_508);
    (*(pJVar16->super_JointPolicyValuePair).super_PolicyPoolItemInterface.
      _vptr_PolicyPoolItemInterface[3])();
    local_530 = dVar17;
    dVar17 = PlanningUnitDecPOMDPDiscrete::GetDiscount((PlanningUnitDecPOMDPDiscrete *)0x97cff4);
    auVar19 = vcvtusi2sd_avx512f(auVar19,local_38);
    local_538 = pow(dVar17,auVar19._0_8_);
    dVar17 = local_538 * local_530;
    local_540 = dVar17;
    pBVar11 = boost::shared_ptr<BayesianGameForDecPOMDPStage>::operator->(&local_78);
    psVar21 = &local_558;
    boost::shared_ptr<JointPolicyDiscretePure>::shared_ptr<JointPolicyPureVector>
              (psVar21,&local_518);
    (*(pBVar11->super_BayesianGameForDecPOMDPStageInterface).
      _vptr_BayesianGameForDecPOMDPStageInterface[5])(pBVar11,psVar21,0);
    boost::shared_ptr<JointPolicyDiscretePure>::~shared_ptr
              ((shared_ptr<JointPolicyDiscretePure> *)0x97d094);
    auVar18 = ZEXT864((ulong)dVar17);
    local_568 = local_240 + dVar17;
    local_548 = dVar17;
    pPVar6 = boost::shared_ptr<PartialJointPolicyDiscretePure>::operator->(&local_528);
    PartialJointPolicy::SetPastReward(&pPVar6->super_PartialJointPolicy,local_568);
    if ((local_45 & 1) == 0) {
      local_570 = local_240 + local_540;
    }
    else {
      local_570 = local_568;
    }
    in_stack_fffffffffffff8d0 =
         (allocator_type *)boost::shared_ptr<PartialPolicyPoolInterface>::operator->(local_18);
    dVar17 = local_570;
    (*in_RDI->_vptr_PlanningUnit[0x16])(local_580,in_RDI,&local_528);
    (*(*(_func_int ***)in_stack_fffffffffffff8d0)[8])(in_stack_fffffffffffff8d0,local_580);
    boost::shared_ptr<PartialPolicyPoolItemInterface>::~shared_ptr
              ((shared_ptr<PartialPolicyPoolItemInterface> *)0x97d208);
    boost::shared_ptr<PartialJointPolicyDiscretePure>::~shared_ptr
              ((shared_ptr<PartialJointPolicyDiscretePure> *)0x97d215);
    boost::shared_ptr<JointPolicyPureVector>::~shared_ptr
              ((shared_ptr<JointPolicyPureVector> *)0x97d222);
    boost::shared_ptr<JPPVValuePair>::~shared_ptr((shared_ptr<JPPVValuePair> *)0x97d22f);
    local_4f8 = local_4f8 + 1;
  } while( true );
}

Assistant:

bool GMAA_kGMAA::ConstructAndValuateNextPolicies(
        const PartialPolicyPoolItemInterface_sharedPtr &ppi, 
        const PartialPolicyPoolInterface_sharedPtr &poolOfNextPolicies,
        bool &cleanUpPPI)
{
    cleanUpPPI=true;
    PJPDP_sharedPtr jpolPrevTs = ppi->GetJPol();//jpol^ts-1
    size_t ts = jpolPrevTs->GetDepth();     // = depth = ts(jpolPrevTs) + 1
    bool is_last_ts = (ts ==  GetHorizon() - 1);

    vector<Index> firstOHtsI(GetNrAgents());
    for(Index agI=0; agI < GetNrAgents(); agI++)
        firstOHtsI.at(agI) = CastLIndexToIndex(GetFirstObservationHistoryIndex(agI, ts));
    // Construct the bayesian game for this timestep - 
    boost::shared_ptr<BayesianGameForDecPOMDPStage> bg_ts=
        boost::shared_ptr<BayesianGameForDecPOMDPStage>(
        new BayesianGameForDecPOMDPStage(
            this,
            _m_qHeuristic,
            jpolPrevTs
            ));

    _m_bgCounter++;
    if(_m_bgBaseFilename!="")
    {
        stringstream ss;
        ss << _m_bgBaseFilename << _m_bgCounter;
        BayesianGameIdenticalPayoff::Save(*bg_ts,ss.str());
    }

    double prevPastReward = jpolPrevTs->GetPastReward();
    const vector<size_t>& nrOHts = bg_ts->GetNrTypes(); 
    //size_t nrJOHts = bg_ts->GetNrJointTypes(); 

    //The set of Indicies of the policies added to poolOfNextPolicies
    //(to avoid adding duplicates).
    set<Index> poolOfNextPoliciesIndices;

    //the policy for the Bayesian game 
    JointPolicyPureVector jpolBG = JointPolicyPureVector(bg_ts,
            PolicyGlobals::TYPE_INDEX);

    stringstream ss;
    ss << "GMAA::kGMAA_ts" << ts;
    StartTimer(ss.str());
    
    //solve the Bayesian game
    //boost::shared_ptr<
    //BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector> > bgips=
        //boost::shared_ptr<BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector> >((*_m_newBGIP_Solver)(bg_ts));
    boost::shared_ptr<BayesianGameIdenticalPayoffSolver> bgips =
        boost::shared_ptr<BayesianGameIdenticalPayoffSolver>(
                _m_newBGIP_Solver->operator()(bg_ts)
                );

    SetCBGbounds(ppi,bgips);
    bgips->Solve();

    //for each solution in BGIPSolution  
    bg_ts->ComputeAllImmediateRewards();
    for(Index solI=0; solI < _m_nrPoliciesToProcess; solI++)
    {
        if(bgips->IsEmptyJPPV())
        {
            cerr << "Warning, BGIP_Solver only returned "<<solI<<
                " usable joint policies"<<endl;
            break;
        }
        const boost::shared_ptr<JPPVValuePair> jpvp = bgips->GetNextSolutionJPPV();
        JPPV_sharedPtr bgpol = jpvp->GetJPPV();

        bgips->PopNextSolutionJPPV();
        PJPDP_sharedPtr jpolTs = 
            ConstructExtendedJointPolicy(*jpolPrevTs,
                                    *bgpol, nrOHts, firstOHtsI);

        double val = jpvp->GetValue();
        double discountToThePowerT = pow( GetDiscount(), (double)(ts) );
        double discounted_F = discountToThePowerT * val;

        //compute expected immediate reward for this stage
        double immR = bg_ts->ComputeDiscountedImmediateRewardForJPol(bgpol);
        double newPastreward = prevPastReward + immR;
        jpolTs->SetPastReward(newPastreward);
        
        ////if last stage, if so, we want to return the 
        ////*EXACT* past reward, newPastreward.
        double newValue;
        if(is_last_ts)
            newValue = newPastreward;
        else
            newValue = prevPastReward + discounted_F;

        //push this policy and value on the priority queue
        poolOfNextPolicies->Insert( NewPPI(jpolTs,newValue) );

        /*//push this policy and value on the priority queue
        ////if last stage, if so, we want to return the 
        ///[>EXACT* past reward, newPastreward.
        if(is_last_ts)
            poolOfNextPolicies->Insert( NewPPI(jpolTs,newPastreward) );
        else // VAL SHOULD BE DISCOUNTED?
            poolOfNextPolicies->Insert( NewPPI(jpolTs,
                                        val + prevPastReward) );*/

    }
    //empty the imm reward cache
    bg_ts->ClearAllImmediateRewards();

    StopTimer(ss.str());
    //if we created a BG for the last time step t=h-1 - we have a lowerbound
    return(is_last_ts);
}